

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::GlobalClockFunction::GlobalClockFunction(GlobalClockFunction *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__GlobalClockFunction_00ff47b8;
  return;
}

Assistant:

GlobalClockFunction() :
        SystemSubroutine(KnownSystemName::GlobalClock, SubroutineKind::Function) {}